

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O3

bool __thiscall Turn::removeTurn(Turn *this,NurseSolution *nurseSolution)

{
  NurseSolution **__src;
  bool bVar1;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  _Var2;
  NurseSolution **ppNVar3;
  NurseSolution *local_20;
  NurseSolution *local_18;
  
  local_20 = nurseSolution;
  local_18 = nurseSolution;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution_const*const>>
                    ((this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if ((_Var2._M_current !=
       (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (bVar1 = NurseSolution::hasTurn(nurseSolution,this), bVar1)) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution*const>>
                      ((this->nurses).
                       super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->nurses).
                       super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_20);
    __src = _Var2._M_current + 1;
    ppNVar3 = (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (__src != ppNVar3) {
      memmove(_Var2._M_current,__src,(long)ppNVar3 - (long)__src);
      ppNVar3 = (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar3 + -1;
    NurseSolution::removeTurn(local_20,this);
    return true;
  }
  return false;
}

Assistant:

const bool Turn::removeTurn(NurseSolution *nurseSolution) {
    if (!hasNurse(nurseSolution) || !nurseSolution->hasTurn(this))
        return false;

    nurses.erase(find(begin(nurses), end(nurses), nurseSolution));
    nurseSolution->removeTurn(this);

    return true;
}